

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void detectStreamReader(char *fileName,MPLSParser *mplsParser,bool isSubMode)

{
  pointer pcVar1;
  undefined8 uVar2;
  long *plVar3;
  ostream *poVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  string descr;
  DetectStreamRez streamInfo;
  string postfix;
  MPLSStreamInfo mplsStreamInfo;
  string local_140;
  long *local_120;
  long local_118;
  long local_110 [2];
  DetectStreamRez local_100;
  undefined4 local_c8;
  uint local_c4;
  char *local_c0;
  long local_b8;
  char local_b0;
  undefined7 uStack_af;
  undefined1 local_a0 [36];
  bool local_7c;
  byte local_5f;
  bool local_5e;
  MPLSStreamInfo *local_58;
  MPLSStreamInfo *local_50;
  
  local_c8 = (undefined4)CONCAT71(in_register_00000011,isSubMode);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a0,fileName,(allocator<char> *)&local_c0);
  METADemuxer::DetectStreamReader
            (&local_100,&readManager,(string *)local_a0,mplsParser == (MPLSParser *)0x0);
  if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
    operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),local_a0._16_8_ + 1);
  }
  if (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    uVar6 = 1;
    do {
      if (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5].trackID != 0) {
        if ((int)uVar6 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
          sLastMsg = true;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Track ID:    ",0xd);
        plVar3 = (long *)std::ostream::operator<<
                                   ((ostream *)&std::cout,
                                    local_100.streams.
                                    super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5].trackID);
        std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
        std::ostream::put((char)plVar3);
        std::ostream::flush();
        sLastMsg = true;
      }
      if (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.codecID == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Can\'t detect stream type",0x18);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        sLastMsg = true;
      }
      else {
        if (mplsParser != (MPLSParser *)0x0) {
          MPLSParser::getStreamByPID
                    ((MPLSStreamInfo *)local_a0,mplsParser,
                     local_100.streams.
                     super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5].trackID);
          if (local_a0._0_4_ == 0) {
            if ((local_100.streams.
                 super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5].codecInfo.codecID != 0xe) ||
               (mplsParser->isDependStreamExist == false)) {
              local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar5].unused = true;
            }
          }
          else if (local_7c == true) {
            local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5].isSecondary = true;
          }
          MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_a0);
        }
        local_c0 = &local_b0;
        local_b8 = 0;
        local_b0 = '\0';
        if (((char)local_c8 != '\0') &&
           (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.codecID == 0xc)) {
          std::__cxx11::string::_M_replace((ulong)&local_c0,0,(char *)0x0,0x208b8e);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Stream type: ",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_100.streams.
                            super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.displayName.
                            _M_dataplus._M_p,
                            local_100.streams.
                            super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.displayName.
                            _M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_c0,local_b8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        sLastMsg = true;
        if (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5].isSecondary == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Secondary: 1",0xc);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        sLastMsg = true;
        if (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5].unused == true) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Unselected: 1",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        sLastMsg = true;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Stream ID:   ",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_100.streams.
                            super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.programName.
                            _M_dataplus._M_p,
                            local_100.streams.
                            super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.programName.
                            _M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        sLastMsg = true;
        local_120 = local_110;
        pcVar1 = local_100.streams.
                 super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar5].streamDescr._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,pcVar1,
                   pcVar1 + local_100.streams.
                            super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5].streamDescr.
                            _M_string_length);
        if (((mplsParser != (MPLSParser *)0x0) &&
            (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.codecID == 0xc)) &&
           (mplsParser->isDependStreamExist == true)) {
          MPLSParser::getStreamByPID
                    ((MPLSStreamInfo *)local_a0,mplsParser,
                     local_100.streams.
                     super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar5].trackID);
          if ((int)local_a0._0_4_ < 0x1200) {
LAB_00196672:
            std::__cxx11::string::append((char *)&local_120);
          }
          else {
            if (local_5f == 0xff) {
              std::__cxx11::string::append((char *)&local_120);
            }
            else {
              std::__cxx11::string::append((char *)&local_120);
              local_c4 = (uint)local_5f;
              int32ToStr_abi_cxx11_(&local_140,(int32_t *)&local_c4);
              std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_5e == true) {
              std::__cxx11::string::append((char *)&local_120);
              std::__cxx11::string::append((char *)&local_120);
              int32ToStr_abi_cxx11_(&local_140,(int32_t *)local_50);
              std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::string::append((char *)&local_120);
              std::__cxx11::string::append((char *)&local_120);
              int32ToStr_abi_cxx11_(&local_140,(int32_t *)local_58);
              std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_140._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
              goto LAB_00196672;
            }
          }
          MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_a0);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Stream info: ",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_120,local_118);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        sLastMsg = true;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Stream lang: ",0xd);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_100.streams.
                            super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5].lang._M_dataplus._M_p,
                            local_100.streams.
                            super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar5].lang._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        sLastMsg = true;
        if (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5].delay != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Stream delay: ",0xe);
          poVar4 = std::ostream::_M_insert<long>((long)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        sLastMsg = true;
        if (local_100.streams.super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar5].multiSubStream == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"subTrack: ",10);
          plVar3 = (long *)std::ostream::operator<<
                                     ((ostream *)&std::cout,
                                      (local_100.streams.
                                       super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar5].codecInfo.
                                       codecID != 0xe) + 1);
          std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
          std::ostream::put((char)plVar3);
          std::ostream::flush();
        }
        sLastMsg = true;
        if (local_120 != local_110) {
          operator_delete(local_120,local_110[0] + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
        }
      }
      uVar5 = ((long)local_100.streams.
                     super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_100.streams.
                     super__Vector_base<CheckStreamRez,_std::allocator<CheckStreamRez>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5) * -0x3333333333333333;
      bVar8 = uVar6 <= uVar5;
      lVar7 = uVar5 - uVar6;
      uVar5 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar8 && lVar7 != 0);
  }
  if ((local_100.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_100.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
       super__Vector_impl_data._M_finish) || (0 < local_100.fileDurationNano)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    sLastMsg = true;
  }
  if (local_100.fileDurationNano != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Duration: ",10);
    floatToTime_abi_cxx11_((string *)local_a0,(double)local_100.fileDurationNano / 1000000000.0,'.')
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                        local_a0._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),local_a0._16_8_ + 1);
    }
    sLastMsg = true;
  }
  if (local_100.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_100.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0;
    uVar5 = 0;
    do {
      uVar2 = *(undefined8 *)
               ((long)&(local_100.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>
                        ._M_impl.super__Vector_impl_data._M_start)->start + lVar7);
      if ((uVar5 / 5) * 5 == uVar5) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        sLastMsg = true;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Marks: ",7);
        sLastMsg = true;
      }
      auVar9._8_4_ = (int)((ulong)uVar2 >> 0x20);
      auVar9._0_8_ = uVar2;
      auVar9._12_4_ = 0x45300000;
      floatToTime_abi_cxx11_
                ((string *)local_a0,
                 ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) / 1000000000.0,'.')
      ;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)CONCAT44(local_a0._4_4_,local_a0._0_4_),
                          local_a0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      if ((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_) != local_a0 + 0x10) {
        operator_delete((undefined1 *)CONCAT44(local_a0._4_4_,local_a0._0_4_),local_a0._16_8_ + 1);
      }
      sLastMsg = true;
      uVar5 = uVar5 + 1;
      lVar7 = lVar7 + 0x28;
    } while (uVar5 < (ulong)(((long)local_100.chapters.
                                    super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_100.chapters.
                                    super__Vector_base<AVChapter,_std::allocator<AVChapter>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x3333333333333333));
  }
  if ((local_100.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_100.chapters.super__Vector_base<AVChapter,_std::allocator<AVChapter>_>._M_impl.
       super__Vector_impl_data._M_finish) || (0 < local_100.fileDurationNano)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"",0);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    sLastMsg = true;
  }
  std::vector<CheckStreamRez,_std::allocator<CheckStreamRez>_>::~vector(&local_100.streams);
  std::vector<AVChapter,_std::allocator<AVChapter>_>::~vector(&local_100.chapters);
  return;
}

Assistant:

void detectStreamReader(const char* fileName, MPLSParser* mplsParser, bool isSubMode)
{
    DetectStreamRez streamInfo = METADemuxer::DetectStreamReader(readManager, fileName, mplsParser == nullptr);
    vector<CheckStreamRez>& streams = streamInfo.streams;

    for (unsigned i = 0; i < streams.size(); i++)
    {
        if (streams[i].trackID != 0)
        {
            if (i > 0)
                LTRACE(LT_INFO, 2, "");
            LTRACE(LT_INFO, 2, "Track ID:    " << streams[i].trackID);
        }
        if (streams[i].codecInfo.codecID)
        {
            if (mplsParser)
            {
                MPLSStreamInfo mplsStreamInfo = mplsParser->getStreamByPID(streams[i].trackID);
                if (mplsStreamInfo.streamPID)
                {
                    if (mplsStreamInfo.isSecondary)
                        streams[i].isSecondary = true;
                }
                else
                {
                    if (!(streams[i].codecInfo.codecID == CODEC_V_MPEG4_H264_DEP && mplsParser->isDependStreamExist))
                        streams[i].unused = true;
                }
            }

            string postfix;
            if (isSubMode && streams[i].codecInfo.codecID == CODEC_S_PGS)
                postfix = " (depended view)";
            LTRACE(LT_INFO, 2, "Stream type: " << streams[i].codecInfo.displayName << postfix);
            if (streams[i].isSecondary)
                LTRACE(LT_INFO, 2, "Secondary: 1");
            if (streams[i].unused)
                LTRACE(LT_INFO, 2, "Unselected: 1");

            LTRACE(LT_INFO, 2, "Stream ID:   " << streams[i].codecInfo.programName);
            std::string descr = streams[i].streamDescr;
            if (streams[i].codecInfo.codecID == CODEC_S_PGS && mplsParser && mplsParser->isDependStreamExist)
            {
                // PG stream
                MPLSStreamInfo mplsStreamInfo = mplsParser->getStreamByPID(streams[i].trackID);
                int pgTrackNum = mplsStreamInfo.streamPID - 0x1200;
                if (pgTrackNum >= 0)
                {
                    if (mplsStreamInfo.offsetId != 0xff)
                    {
                        descr += "   3d-plane: ";
                        descr += int32ToStr(mplsStreamInfo.offsetId);
                    }
                    else
                    {
                        descr += "   3d-plane: undefined";
                    }
                    if (mplsStreamInfo.isSSPG)
                    {
                        descr += "   (stereo, right=";
                        descr += (mplsStreamInfo.rightEye->type == 2 ? "dep-view " : "");
                        descr += int32ToStr(mplsStreamInfo.rightEye->streamPID);
                        descr += ", left=";
                        descr += (mplsStreamInfo.leftEye->type == 2 ? "dep-view " : "");
                        descr += int32ToStr(mplsStreamInfo.leftEye->streamPID);
                        descr += ")";
                    }
                }
                else
                    descr += "   (disabled)";
            }
            LTRACE(LT_INFO, 2, "Stream info: " << descr);
            LTRACE(LT_INFO, 2, "Stream lang: " << streams[i].lang);
            if (streams[i].delay)
                LTRACE(LT_INFO, 2, "Stream delay: " << streams[i].delay);
            if (streams[i].multiSubStream)
                LTRACE(LT_INFO, 2, "subTrack: " << (streams[i].codecInfo.codecID == CODEC_V_MPEG4_H264_DEP ? 1 : 2));
        }
        else
            LTRACE(LT_INFO, 2, "Can't detect stream type");
    }

    AVChapters& chapters = streamInfo.chapters;
    if (!chapters.empty() || streamInfo.fileDurationNano > 0)
        LTRACE(LT_INFO, 2, "");
    if (streamInfo.fileDurationNano)
        LTRACE(LT_INFO, 2, "Duration: " << floatToTime((double)streamInfo.fileDurationNano / 1e9));
    for (size_t j = 0; j < chapters.size(); j++)
    {
        uint64_t time = chapters[j].start;
        if (j % 5 == 0)
        {
            LTRACE(LT_INFO, 2, "");
            LTRACE2(LT_INFO, "Marks: ")
        }
        LTRACE2(LT_INFO, floatToTime((double)time / 1e9) << " ")
    }
    if (!chapters.empty() || streamInfo.fileDurationNano > 0)
        LTRACE(LT_INFO, 2, "");
}